

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::~IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  bool *pbVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68 =
       0x8eaf28;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.have =
       0x8eaf50;
  pbVar1 = &this[-1].InternalFilletRadius.have;
  if ((bool *)this[-1].Girth != pbVar1) {
    operator_delete((undefined1 *)this[-1].Girth,*(long *)pbVar1 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if ((Out *)puVar2 != &this[-1].Width) {
    operator_delete(puVar2,(long)this[-1].Width + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68,0xd8);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}